

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O1

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::vSolveUrightNoNZ(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *vec,
                  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *rhs,int *ridx,int rn,
                  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *eps)

{
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar1;
  uint uVar2;
  uint uVar3;
  undefined8 uVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  int iVar7;
  int iVar8;
  int iVar9;
  cpp_dec_float<50U,_int,_void> *pcVar10;
  uint uVar11;
  ulong uVar12;
  cpp_dec_float<50U,_int,_void> *pcVar13;
  uint uVar14;
  uint *puVar15;
  cpp_dec_float<50U,_int,_void> *pcVar16;
  int *piVar17;
  double a;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  cpp_dec_float<50U,_int,_void> local_248;
  uint local_20c;
  cpp_dec_float<50U,_int,_void> local_208;
  uint *local_1c8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1c0;
  cpp_dec_float<50U,_int,_void> local_1b8;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_178;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_170;
  int *local_168;
  pointer local_160;
  int *local_158;
  int *local_150;
  int *local_148;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_140;
  int *local_138;
  int *local_130;
  cpp_dec_float<50U,_int,_void> local_128;
  cpp_dec_float<50U,_int,_void> local_e8;
  cpp_dec_float<50U,_int,_void> local_a8;
  cpp_dec_float<50U,_int,_void> local_68;
  
  local_208.fpclass = cpp_dec_float_finite;
  local_208.prec_elem = 10;
  local_208.data._M_elems[0] = 0;
  local_208.data._M_elems[1] = 0;
  local_208.data._M_elems[2] = 0;
  local_208.data._M_elems[3] = 0;
  local_208.data._M_elems[4] = 0;
  local_208.data._M_elems[5] = 0;
  local_208.data._M_elems._24_5_ = 0;
  local_208.data._M_elems[7]._1_3_ = 0;
  local_208.data._M_elems[8] = 0;
  local_208.data._M_elems[9] = 0;
  local_208.exp = 0;
  local_208.neg = false;
  local_1b8.fpclass = cpp_dec_float_finite;
  local_1b8.prec_elem = 10;
  local_1b8.data._M_elems[0] = 0;
  local_1b8.data._M_elems[1] = 0;
  local_1b8.data._M_elems[2] = 0;
  local_1b8.data._M_elems[3] = 0;
  local_1b8.data._M_elems[4] = 0;
  local_1b8.data._M_elems[5] = 0;
  local_1b8.data._M_elems._24_5_ = 0;
  local_1b8.data._M_elems[7]._1_3_ = 0;
  local_1b8.data._M_elems[8] = 0;
  local_1b8.data._M_elems[9] = 0;
  local_1b8.exp = 0;
  local_1b8.neg = false;
  if (0 < rn) {
    local_138 = (this->row).orig;
    local_130 = (this->row).perm;
    local_148 = (this->col).orig;
    local_158 = (this->u).col.idx;
    local_160 = (this->u).col.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    local_150 = (this->u).col.len;
    local_168 = (this->u).col.start;
    local_1c8 = (uint *)ridx;
    local_1c0 = rhs;
    local_178 = this;
    local_170 = eps;
    local_140 = vec;
    do {
      uVar2 = *ridx;
      if ((double)(int)uVar2 * 0.2 < (double)rn) {
        if ((int)uVar2 < 0) {
          return;
        }
        uVar12 = (ulong)uVar2;
        do {
          pcVar13 = &local_1c0[local_138[uVar12]].m_backend;
          pcVar10 = &(local_178->diag).
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[local_138[uVar12]].m_backend;
          local_248.fpclass = cpp_dec_float_finite;
          local_248.prec_elem = 10;
          local_248.data._M_elems[0] = 0;
          local_248.data._M_elems[1] = 0;
          local_248.data._M_elems[2] = 0;
          local_248.data._M_elems[3] = 0;
          local_248.data._M_elems[4] = 0;
          local_248.data._M_elems[5] = 0;
          local_248.data._M_elems._24_5_ = 0;
          local_248.data._M_elems[7]._1_3_ = 0;
          local_248.data._M_elems._32_5_ = 0;
          local_248.data._M_elems[9]._1_3_ = 0;
          local_248.exp = 0;
          local_248.neg = false;
          pcVar16 = pcVar10;
          if ((&local_248 != pcVar13) && (pcVar16 = pcVar13, &local_248 != pcVar10)) {
            uVar4 = *(undefined8 *)((pcVar10->data)._M_elems + 8);
            local_248.data._M_elems._32_5_ = SUB85(uVar4,0);
            local_248.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
            local_248.data._M_elems._0_8_ = *(undefined8 *)(pcVar10->data)._M_elems;
            local_248.data._M_elems._8_8_ = *(undefined8 *)((pcVar10->data)._M_elems + 2);
            local_248.data._M_elems._16_8_ = *(undefined8 *)((pcVar10->data)._M_elems + 4);
            uVar4 = *(undefined8 *)((pcVar10->data)._M_elems + 6);
            local_248.data._M_elems._24_5_ = SUB85(uVar4,0);
            local_248.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
            local_248.exp = pcVar10->exp;
            local_248.neg = pcVar10->neg;
            local_248.fpclass = pcVar10->fpclass;
            local_248.prec_elem = pcVar10->prec_elem;
          }
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                    (&local_248,pcVar16);
          local_208.data._M_elems[0] = local_248.data._M_elems[0];
          local_208.data._M_elems[1] = local_248.data._M_elems[1];
          local_208.data._M_elems[2] = local_248.data._M_elems[2];
          local_208.data._M_elems[3] = local_248.data._M_elems[3];
          local_208.data._M_elems[4] = local_248.data._M_elems[4];
          local_208.data._M_elems[5] = local_248.data._M_elems[5];
          local_208.data._M_elems._24_5_ = local_248.data._M_elems._24_5_;
          local_208.data._M_elems[7]._1_3_ = local_248.data._M_elems[7]._1_3_;
          local_208.data._M_elems[9]._1_3_ = local_248.data._M_elems[9]._1_3_;
          local_208.data._M_elems._32_5_ = local_248.data._M_elems._32_5_;
          local_208.exp = local_248.exp;
          local_208.neg = local_248.neg;
          local_208.fpclass = local_248.fpclass;
          local_208.prec_elem = local_248.prec_elem;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=(pcVar13,0);
          local_248.data._M_elems._32_5_ = local_208.data._M_elems._32_5_;
          local_248.data._M_elems[9]._1_3_ = local_208.data._M_elems[9]._1_3_;
          local_248.data._M_elems[4] = local_208.data._M_elems[4];
          local_248.data._M_elems[5] = local_208.data._M_elems[5];
          local_248.data._M_elems._24_5_ = local_208.data._M_elems._24_5_;
          local_248.data._M_elems[7]._1_3_ = local_208.data._M_elems[7]._1_3_;
          local_248.data._M_elems[2] = local_208.data._M_elems[2];
          local_248.data._M_elems[3] = local_208.data._M_elems[3];
          local_248.data._M_elems[0] = local_208.data._M_elems[0];
          local_248.data._M_elems[1] = local_208.data._M_elems[1];
          auVar6 = (undefined1  [16])local_248.data._M_elems._0_16_;
          local_68.data._M_elems._0_8_ = *(undefined8 *)(local_170->m_backend).data._M_elems;
          local_68.data._M_elems._8_8_ = *(undefined8 *)((local_170->m_backend).data._M_elems + 2);
          local_68.data._M_elems._16_8_ = *(undefined8 *)((local_170->m_backend).data._M_elems + 4);
          local_68.data._M_elems._24_8_ = *(undefined8 *)((local_170->m_backend).data._M_elems + 6);
          local_68.data._M_elems._32_8_ = *(undefined8 *)((local_170->m_backend).data._M_elems + 8);
          local_68.exp = (local_170->m_backend).exp;
          local_68.neg = (local_170->m_backend).neg;
          local_68.fpclass = (local_170->m_backend).fpclass;
          local_68.prec_elem = (local_170->m_backend).prec_elem;
          local_248.exp = local_208.exp;
          local_248.neg = local_208.neg;
          local_248.fpclass = local_208.fpclass;
          local_248.prec_elem = local_208.prec_elem;
          if ((local_208.neg == true) &&
             (local_248.data._M_elems[0] = local_208.data._M_elems[0],
             local_248.data._M_elems[0] != 0 || local_208.fpclass != cpp_dec_float_finite)) {
            local_248.neg = false;
          }
          if ((local_68.fpclass != cpp_dec_float_NaN && local_208.fpclass != cpp_dec_float_NaN) &&
             (local_248.data._M_elems._0_16_ = auVar6,
             iVar7 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (&local_248,&local_68), 0 < iVar7)) {
            iVar7 = local_148[uVar12];
            *(undefined8 *)(local_140[iVar7].m_backend.data._M_elems + 8) =
                 local_208.data._M_elems._32_8_;
            puVar15 = local_140[iVar7].m_backend.data._M_elems + 4;
            *(undefined8 *)puVar15 = local_208.data._M_elems._16_8_;
            *(ulong *)(puVar15 + 2) =
                 CONCAT35(local_208.data._M_elems[7]._1_3_,local_208.data._M_elems._24_5_);
            *(undefined8 *)local_140[iVar7].m_backend.data._M_elems = local_208.data._M_elems._0_8_;
            *(undefined8 *)(local_140[iVar7].m_backend.data._M_elems + 2) =
                 local_208.data._M_elems._8_8_;
            local_140[iVar7].m_backend.exp = local_208.exp;
            local_140[iVar7].m_backend.neg = local_208.neg;
            local_140[iVar7].m_backend.fpclass = local_208.fpclass;
            local_140[iVar7].m_backend.prec_elem = local_208.prec_elem;
            if (0 < local_150[iVar7]) {
              piVar17 = local_158 + local_168[iVar7];
              pcVar13 = &local_160[local_168[iVar7]].m_backend;
              iVar7 = local_150[iVar7] + 1;
              do {
                local_248.fpclass = cpp_dec_float_finite;
                local_248.prec_elem = 10;
                local_248.data._M_elems[0] = 0;
                local_248.data._M_elems[1] = 0;
                local_248.data._M_elems[2] = 0;
                local_248.data._M_elems[3] = 0;
                local_248.data._M_elems[4] = 0;
                local_248.data._M_elems[5] = 0;
                local_248.data._M_elems._24_5_ = 0;
                local_248.data._M_elems[7]._1_3_ = 0;
                local_248.data._M_elems._32_5_ = 0;
                local_248.data._M_elems[9]._1_3_ = 0;
                local_248.exp = 0;
                local_248.neg = false;
                pcVar16 = &local_208;
                if (pcVar13 != &local_248) {
                  local_248.data._M_elems._32_5_ = local_208.data._M_elems._32_5_;
                  local_248.data._M_elems[9]._1_3_ = local_208.data._M_elems[9]._1_3_;
                  local_248.data._M_elems[4] = local_208.data._M_elems[4];
                  local_248.data._M_elems[5] = local_208.data._M_elems[5];
                  local_248.data._M_elems._24_5_ = local_208.data._M_elems._24_5_;
                  local_248.data._M_elems[7]._1_3_ = local_208.data._M_elems[7]._1_3_;
                  local_248.data._M_elems[2] = local_208.data._M_elems[2];
                  local_248.data._M_elems[3] = local_208.data._M_elems[3];
                  local_248.data._M_elems[0] = local_208.data._M_elems[0];
                  local_248.data._M_elems[1] = local_208.data._M_elems[1];
                  local_248.exp = local_208.exp;
                  local_248.neg = local_208.neg;
                  local_248.fpclass = local_208.fpclass;
                  local_248.prec_elem = local_208.prec_elem;
                  pcVar16 = pcVar13;
                }
                pcVar13 = pcVar13 + 1;
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                          (&local_248,pcVar16);
                iVar9 = *piVar17;
                piVar17 = piVar17 + 1;
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          (&local_1c0[iVar9].m_backend,&local_248);
                iVar7 = iVar7 + -1;
              } while (1 < iVar7);
            }
          }
          bVar5 = 0 < (long)uVar12;
          uVar12 = uVar12 - 1;
        } while (bVar5);
        return;
      }
      local_20c = rn - 1;
      uVar11 = ((uint *)ridx)[(long)rn + -1];
      if (rn < 4) {
        iVar7 = 1;
        iVar9 = 0;
      }
      else {
        iVar9 = 0;
        iVar7 = 1;
        do {
          uVar3 = ((uint *)ridx)[iVar7];
          uVar14 = ((uint *)ridx)[(long)iVar7 + 1];
          puVar15 = (uint *)ridx + iVar9;
          if ((int)uVar14 < (int)uVar3) {
            iVar9 = iVar7;
            uVar14 = uVar3;
            if ((int)uVar3 <= (int)uVar11) goto LAB_002aeea2;
          }
          else {
            if ((int)uVar14 <= (int)uVar11) goto LAB_002aeea2;
            iVar9 = iVar7 + 1;
          }
          *puVar15 = uVar14;
          iVar7 = iVar9 * 2 + 1;
        } while (iVar7 < (int)(rn - 2U));
      }
      if ((iVar7 < (int)local_20c) && ((int)uVar11 < (int)((uint *)ridx)[iVar7])) {
        ((uint *)ridx)[iVar9] = ((uint *)ridx)[iVar7];
        iVar9 = iVar7;
      }
      puVar15 = (uint *)ridx + iVar9;
LAB_002aeea2:
      *puVar15 = uVar11;
      pcVar13 = &local_1c0[local_138[(int)uVar2]].m_backend;
      pcVar10 = &(local_178->diag).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[local_138[(int)uVar2]].m_backend;
      local_248.fpclass = cpp_dec_float_finite;
      local_248.prec_elem = 10;
      local_248.data._M_elems[0] = 0;
      local_248.data._M_elems[1] = 0;
      local_248.data._M_elems[2] = 0;
      local_248.data._M_elems[3] = 0;
      local_248.data._M_elems[4] = 0;
      local_248.data._M_elems[5] = 0;
      local_248.data._M_elems._24_5_ = 0;
      local_248.data._M_elems[7]._1_3_ = 0;
      local_248.data._M_elems._32_5_ = 0;
      local_248.data._M_elems[9]._1_3_ = 0;
      local_248.exp = 0;
      local_248.neg = false;
      pcVar16 = pcVar10;
      if ((&local_248 != pcVar13) && (pcVar16 = pcVar13, &local_248 != pcVar10)) {
        uVar4 = *(undefined8 *)((pcVar10->data)._M_elems + 8);
        local_248.data._M_elems._32_5_ = SUB85(uVar4,0);
        local_248.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
        local_248.data._M_elems._0_8_ = *(undefined8 *)(pcVar10->data)._M_elems;
        local_248.data._M_elems._8_8_ = *(undefined8 *)((pcVar10->data)._M_elems + 2);
        local_248.data._M_elems._16_8_ = *(undefined8 *)((pcVar10->data)._M_elems + 4);
        uVar4 = *(undefined8 *)((pcVar10->data)._M_elems + 6);
        local_248.data._M_elems._24_5_ = SUB85(uVar4,0);
        local_248.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
        local_248.exp = pcVar10->exp;
        local_248.neg = pcVar10->neg;
        local_248.fpclass = pcVar10->fpclass;
        local_248.prec_elem = pcVar10->prec_elem;
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_248,pcVar16)
      ;
      local_208.data._M_elems[0] = local_248.data._M_elems[0];
      local_208.data._M_elems[1] = local_248.data._M_elems[1];
      local_208.data._M_elems[2] = local_248.data._M_elems[2];
      local_208.data._M_elems[3] = local_248.data._M_elems[3];
      local_208.data._M_elems[4] = local_248.data._M_elems[4];
      local_208.data._M_elems[5] = local_248.data._M_elems[5];
      local_208.data._M_elems._24_5_ = local_248.data._M_elems._24_5_;
      local_208.data._M_elems[7]._1_3_ = local_248.data._M_elems[7]._1_3_;
      local_208.data._M_elems[9]._1_3_ = local_248.data._M_elems[9]._1_3_;
      local_208.data._M_elems._32_5_ = local_248.data._M_elems._32_5_;
      local_208.exp = local_248.exp;
      local_208.neg = local_248.neg;
      local_208.fpclass = local_248.fpclass;
      local_208.prec_elem = local_248.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=(pcVar13,0);
      local_248.data._M_elems._32_5_ = local_208.data._M_elems._32_5_;
      local_248.data._M_elems[9]._1_3_ = local_208.data._M_elems[9]._1_3_;
      local_248.data._M_elems[4] = local_208.data._M_elems[4];
      local_248.data._M_elems[5] = local_208.data._M_elems[5];
      local_248.data._M_elems._24_5_ = local_208.data._M_elems._24_5_;
      local_248.data._M_elems[7]._1_3_ = local_208.data._M_elems[7]._1_3_;
      local_248.data._M_elems[2] = local_208.data._M_elems[2];
      local_248.data._M_elems[3] = local_208.data._M_elems[3];
      local_248.data._M_elems[0] = local_208.data._M_elems[0];
      local_248.data._M_elems[1] = local_208.data._M_elems[1];
      auVar6 = (undefined1  [16])local_248.data._M_elems._0_16_;
      local_a8.data._M_elems._0_8_ = *(undefined8 *)(local_170->m_backend).data._M_elems;
      local_a8.data._M_elems._8_8_ = *(undefined8 *)((local_170->m_backend).data._M_elems + 2);
      local_a8.data._M_elems._16_8_ = *(undefined8 *)((local_170->m_backend).data._M_elems + 4);
      local_a8.data._M_elems._24_8_ = *(undefined8 *)((local_170->m_backend).data._M_elems + 6);
      local_a8.data._M_elems._32_8_ = *(undefined8 *)((local_170->m_backend).data._M_elems + 8);
      local_a8.exp = (local_170->m_backend).exp;
      local_a8.neg = (local_170->m_backend).neg;
      local_a8.fpclass = (local_170->m_backend).fpclass;
      local_a8.prec_elem = (local_170->m_backend).prec_elem;
      local_248.exp = local_208.exp;
      local_248.neg = local_208.neg;
      local_248.fpclass = local_208.fpclass;
      local_248.prec_elem = local_208.prec_elem;
      if ((local_208.neg == true) &&
         (local_248.data._M_elems[0] = local_208.data._M_elems[0],
         local_248.data._M_elems[0] != 0 || local_208.fpclass != cpp_dec_float_finite)) {
        local_248.neg = false;
      }
      if ((local_a8.fpclass != cpp_dec_float_NaN && local_208.fpclass != cpp_dec_float_NaN) &&
         (local_248.data._M_elems._0_16_ = auVar6,
         iVar7 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&local_248,&local_a8), 0 < iVar7)) {
        iVar7 = local_148[(int)uVar2];
        *(undefined8 *)(local_140[iVar7].m_backend.data._M_elems + 8) =
             local_208.data._M_elems._32_8_;
        puVar15 = local_140[iVar7].m_backend.data._M_elems + 4;
        *(undefined8 *)puVar15 = local_208.data._M_elems._16_8_;
        *(ulong *)(puVar15 + 2) =
             CONCAT35(local_208.data._M_elems[7]._1_3_,local_208.data._M_elems._24_5_);
        *(undefined8 *)local_140[iVar7].m_backend.data._M_elems = local_208.data._M_elems._0_8_;
        *(undefined8 *)(local_140[iVar7].m_backend.data._M_elems + 2) =
             local_208.data._M_elems._8_8_;
        local_140[iVar7].m_backend.exp = local_208.exp;
        local_140[iVar7].m_backend.neg = local_208.neg;
        local_140[iVar7].m_backend.fpclass = local_208.fpclass;
        local_140[iVar7].m_backend.prec_elem = local_208.prec_elem;
        if (0 < local_150[iVar7]) {
          piVar17 = local_158 + local_168[iVar7];
          pcVar13 = &local_160[local_168[iVar7]].m_backend;
          iVar7 = local_150[iVar7];
          do {
            iVar9 = *piVar17;
            pnVar1 = local_1c0 + iVar9;
            local_1b8.data._M_elems._32_8_ =
                 *(undefined8 *)(local_1c0[iVar9].m_backend.data._M_elems + 8);
            local_1b8.data._M_elems._0_8_ = *(undefined8 *)local_1c0[iVar9].m_backend.data._M_elems;
            local_1b8.data._M_elems._8_8_ =
                 *(undefined8 *)(local_1c0[iVar9].m_backend.data._M_elems + 2);
            puVar15 = local_1c0[iVar9].m_backend.data._M_elems + 4;
            local_1b8.data._M_elems._16_8_ = *(undefined8 *)puVar15;
            uVar4 = *(undefined8 *)(puVar15 + 2);
            local_1b8.data._M_elems._24_5_ = SUB85(uVar4,0);
            local_1b8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
            local_1b8.exp = local_1c0[iVar9].m_backend.exp;
            local_1b8.neg = local_1c0[iVar9].m_backend.neg;
            local_1b8.fpclass = local_1c0[iVar9].m_backend.fpclass;
            local_1b8.prec_elem = local_1c0[iVar9].m_backend.prec_elem;
            if (local_1b8.fpclass == cpp_dec_float_NaN) {
LAB_002af18e:
              local_248.fpclass = cpp_dec_float_finite;
              local_248.prec_elem = 10;
              local_248.data._M_elems[0] = 0;
              local_248.data._M_elems[1] = 0;
              local_248.data._M_elems[2] = 0;
              local_248.data._M_elems[3] = 0;
              local_248.data._M_elems[4] = 0;
              local_248.data._M_elems[5] = 0;
              local_248.data._M_elems._24_5_ = 0;
              local_248.data._M_elems[7]._1_3_ = 0;
              local_248.data._M_elems._32_5_ = 0;
              local_248.data._M_elems[9]._1_3_ = 0;
              local_248.exp = 0;
              local_248.neg = false;
              pcVar16 = &local_208;
              if (&local_248 != pcVar13) {
                local_248.data._M_elems._32_5_ = local_208.data._M_elems._32_5_;
                local_248.data._M_elems[9]._1_3_ = local_208.data._M_elems[9]._1_3_;
                local_248.data._M_elems[4] = local_208.data._M_elems[4];
                local_248.data._M_elems[5] = local_208.data._M_elems[5];
                local_248.data._M_elems._24_5_ = local_208.data._M_elems._24_5_;
                local_248.data._M_elems[7]._1_3_ = local_208.data._M_elems[7]._1_3_;
                local_248.data._M_elems[0] = local_208.data._M_elems[0];
                local_248.data._M_elems[1] = local_208.data._M_elems[1];
                local_248.data._M_elems[2] = local_208.data._M_elems[2];
                local_248.data._M_elems[3] = local_208.data._M_elems[3];
                local_248.exp = local_208.exp;
                local_248.neg = local_208.neg;
                local_248.fpclass = local_208.fpclass;
                local_248.prec_elem = local_208.prec_elem;
                pcVar16 = pcVar13;
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                        (&local_248,pcVar16);
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (&local_1b8,&local_248);
              a = 0.0;
              if (local_1b8.fpclass != cpp_dec_float_NaN) {
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                cpp_dec_float<long_long>(&local_248,0,(type *)0x0);
                iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                  (&local_1b8,&local_248);
                a = 1e-100;
                if (iVar9 != 0) {
                  a = 0.0;
                }
              }
              local_248.fpclass = cpp_dec_float_finite;
              local_248.prec_elem = 10;
              local_248.data._M_elems._0_16_ = ZEXT816(0);
              local_248.data._M_elems[4] = 0;
              local_248.data._M_elems[5] = 0;
              local_248.data._M_elems._24_5_ = 0;
              local_248.data._M_elems[7]._1_3_ = 0;
              local_248.data._M_elems._32_5_ = 0;
              local_248.data._M_elems[9]._1_3_ = 0;
              local_248.exp = 0;
              local_248.neg = false;
              boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                        ((cpp_dec_float<50u,int,void> *)&local_248,a);
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                        (&local_1b8,&local_248);
              *(undefined8 *)((pnVar1->m_backend).data._M_elems + 8) =
                   local_1b8.data._M_elems._32_8_;
              *(undefined8 *)((pnVar1->m_backend).data._M_elems + 4) =
                   local_1b8.data._M_elems._16_8_;
              *(ulong *)((pnVar1->m_backend).data._M_elems + 6) =
                   CONCAT35(local_1b8.data._M_elems[7]._1_3_,local_1b8.data._M_elems._24_5_);
              *(undefined8 *)(pnVar1->m_backend).data._M_elems = local_1b8.data._M_elems._0_8_;
              *(undefined8 *)((pnVar1->m_backend).data._M_elems + 2) = local_1b8.data._M_elems._8_8_
              ;
              (pnVar1->m_backend).exp = local_1b8.exp;
              (pnVar1->m_backend).neg = local_1b8.neg;
              (pnVar1->m_backend).fpclass = local_1b8.fpclass;
              (pnVar1->m_backend).prec_elem = local_1b8.prec_elem;
            }
            else {
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
              cpp_dec_float<long_long>(&local_248,0,(type *)0x0);
              iVar8 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                (&local_1b8,&local_248);
              if (iVar8 != 0) goto LAB_002af18e;
              local_128.data._M_elems[7]._1_3_ = local_208.data._M_elems[7]._1_3_;
              local_128.data._M_elems._24_5_ = local_208.data._M_elems._24_5_;
              local_128.data._M_elems[0] = local_208.data._M_elems[0];
              local_128.data._M_elems[1] = local_208.data._M_elems[1];
              uVar4 = local_128.data._M_elems._0_8_;
              local_128.data._M_elems[2] = local_208.data._M_elems[2];
              local_128.data._M_elems[3] = local_208.data._M_elems[3];
              local_128.data._M_elems[8] = local_208.data._M_elems[8];
              local_128.data._M_elems[9] = local_208.data._M_elems[9];
              local_128.data._M_elems[4] = local_208.data._M_elems[4];
              local_128.data._M_elems[5] = local_208.data._M_elems[5];
              local_128.exp = local_208.exp;
              local_128.neg = local_208.neg;
              local_128.fpclass = local_208.fpclass;
              local_128.prec_elem = local_208.prec_elem;
              local_128.data._M_elems[0] = local_208.data._M_elems[0];
              if (local_128.data._M_elems[0] != 0 || local_208.fpclass != cpp_dec_float_finite) {
                local_128.neg = (bool)(local_208.neg ^ 1);
              }
              local_248.fpclass = cpp_dec_float_finite;
              local_248.prec_elem = 10;
              local_248.data._M_elems[0] = 0;
              local_248.data._M_elems[1] = 0;
              local_248.data._M_elems[2] = 0;
              local_248.data._M_elems[3] = 0;
              local_248.data._M_elems[4] = 0;
              local_248.data._M_elems[5] = 0;
              local_248.data._M_elems._24_5_ = 0;
              local_248.data._M_elems[7]._1_3_ = 0;
              local_248.data._M_elems._32_5_ = 0;
              local_248.data._M_elems[9]._1_3_ = 0;
              local_248.exp = 0;
              local_248.neg = false;
              pcVar16 = &local_128;
              if (&local_248 != pcVar13) {
                local_248.data._M_elems._32_5_ = local_208.data._M_elems._32_5_;
                local_248.data._M_elems[9]._1_3_ = local_208.data._M_elems[9]._1_3_;
                local_248.data._M_elems[4] = local_208.data._M_elems[4];
                local_248.data._M_elems[5] = local_208.data._M_elems[5];
                local_248.data._M_elems._24_5_ = local_208.data._M_elems._24_5_;
                local_248.data._M_elems[7]._1_3_ = local_208.data._M_elems[7]._1_3_;
                local_248.data._M_elems[0] = local_208.data._M_elems[0];
                local_248.data._M_elems[1] = local_208.data._M_elems[1];
                local_248.data._M_elems[2] = local_208.data._M_elems[2];
                local_248.data._M_elems[3] = local_208.data._M_elems[3];
                local_248.exp = local_208.exp;
                local_248.neg = local_128.neg;
                local_248.fpclass = local_208.fpclass;
                local_248.prec_elem = local_208.prec_elem;
                pcVar16 = pcVar13;
              }
              local_128.data._M_elems._0_8_ = uVar4;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                        (&local_248,pcVar16);
              local_1b8.data._M_elems[9]._1_3_ = local_248.data._M_elems[9]._1_3_;
              local_1b8.data._M_elems._32_5_ = local_248.data._M_elems._32_5_;
              local_1b8.data._M_elems[4] = local_248.data._M_elems[4];
              local_1b8.data._M_elems[5] = local_248.data._M_elems[5];
              local_1b8.data._M_elems._24_5_ = local_248.data._M_elems._24_5_;
              local_1b8.data._M_elems[7]._1_3_ = local_248.data._M_elems[7]._1_3_;
              local_1b8.data._M_elems[0] = local_248.data._M_elems[0];
              local_1b8.data._M_elems[1] = local_248.data._M_elems[1];
              local_1b8.data._M_elems[2] = local_248.data._M_elems[2];
              local_1b8.data._M_elems[3] = local_248.data._M_elems[3];
              local_1b8.exp = local_248.exp;
              local_1b8.neg = local_248.neg;
              local_1b8.prec_elem = local_248.prec_elem;
              local_1b8.fpclass = local_248.fpclass;
              auVar6 = (undefined1  [16])local_248.data._M_elems._0_16_;
              local_e8.data._M_elems._32_8_ =
                   *(undefined8 *)((local_170->m_backend).data._M_elems + 8);
              local_e8.data._M_elems._0_8_ = *(undefined8 *)(local_170->m_backend).data._M_elems;
              local_e8.data._M_elems._8_8_ =
                   *(undefined8 *)((local_170->m_backend).data._M_elems + 2);
              local_e8.data._M_elems._16_8_ =
                   *(undefined8 *)((local_170->m_backend).data._M_elems + 4);
              local_e8.data._M_elems._24_8_ =
                   *(undefined8 *)((local_170->m_backend).data._M_elems + 6);
              local_e8.exp = (local_170->m_backend).exp;
              local_e8.neg = (local_170->m_backend).neg;
              local_e8.fpclass = (local_170->m_backend).fpclass;
              local_e8.prec_elem = (local_170->m_backend).prec_elem;
              if ((local_248.neg == true) &&
                 (local_248.data._M_elems[0] != 0 || local_248.fpclass != cpp_dec_float_finite)) {
                local_248.neg = false;
              }
              local_248.data._M_elems._0_16_ = auVar6;
              if ((local_e8.fpclass != cpp_dec_float_NaN && local_248.fpclass != cpp_dec_float_NaN)
                 && (iVar8 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                       (&local_248,&local_e8), 0 < iVar8)) {
                *(undefined8 *)((pnVar1->m_backend).data._M_elems + 8) =
                     local_1b8.data._M_elems._32_8_;
                *(undefined8 *)((pnVar1->m_backend).data._M_elems + 4) =
                     local_1b8.data._M_elems._16_8_;
                *(ulong *)((pnVar1->m_backend).data._M_elems + 6) =
                     CONCAT35(local_1b8.data._M_elems[7]._1_3_,local_1b8.data._M_elems._24_5_);
                *(undefined8 *)(pnVar1->m_backend).data._M_elems = local_1b8.data._M_elems._0_8_;
                *(undefined8 *)((pnVar1->m_backend).data._M_elems + 2) =
                     local_1b8.data._M_elems._8_8_;
                (pnVar1->m_backend).exp = local_1b8.exp;
                (pnVar1->m_backend).neg = local_1b8.neg;
                (pnVar1->m_backend).fpclass = local_1b8.fpclass;
                (pnVar1->m_backend).prec_elem = local_1b8.prec_elem;
                uVar2 = local_130[iVar9];
                uVar11 = local_20c;
                if (0 < (int)local_20c) {
                  uVar12 = (ulong)local_20c;
                  do {
                    uVar14 = (uint)uVar12 - 1;
                    uVar3 = uVar14 >> 1;
                    uVar11 = (uint)uVar12;
                    if ((int)uVar2 <= (int)local_1c8[uVar3]) break;
                    local_1c8[uVar12] = local_1c8[uVar3];
                    uVar12 = (ulong)uVar3;
                    uVar11 = uVar3;
                  } while (1 < uVar14);
                }
                local_20c = local_20c + 1;
                local_1c8[(int)uVar11] = uVar2;
              }
            }
            piVar17 = piVar17 + 1;
            pcVar13 = pcVar13 + 1;
            bVar5 = 1 < iVar7;
            ridx = (int *)local_1c8;
            iVar7 = iVar7 + -1;
          } while (bVar5);
        }
      }
      rn = local_20c;
    } while (0 < (int)local_20c);
  }
  return;
}

Assistant:

void CLUFactor<R>::vSolveUrightNoNZ(R* vec,
                                    R* rhs, int* ridx, int rn, R eps)
{
   int i, j, k, r, c;
   int* rorig, *corig;
   int* rperm;
   int* cidx, *clen, *cbeg;
   R* cval;
   R x, y;

   int* idx;
   R* val;

   rorig = row.orig;
   corig = col.orig;
   rperm = row.perm;

   cidx = u.col.idx;
   cval = u.col.val.data();
   clen = u.col.len;
   cbeg = u.col.start;

   while(rn > 0)
   {
      if(rn > *ridx * verySparseFactor4right)
      {
         /* continue with dense case */
         for(i = *ridx; i >= 0; --i)
         {
            assert(i >= 0 && i < thedim);
            r = rorig[i];
            assert(r >= 0 && r < thedim);
            x = diag[r] * rhs[r];
            rhs[r] = 0;

            if(isNotZero(x, eps))
            {
               c = corig[i];
               vec[c] = x;
               val = &cval[cbeg[c]];
               idx = &cidx[cbeg[c]];
               j = clen[c];

               while(j-- > 0)
               {
                  assert(*idx >= 0 && *idx < thedim);
                  rhs[*idx++] -= x * (*val++);
               }
            }
         }

         break;
      }

      /*      Find nonzero with highest permuted row index and setup i and r
       */
      i = deQueueMax(ridx, &rn);

      assert(i >= 0 && i < thedim);

      r = rorig[i];

      assert(r >= 0 && r < thedim);

      x = diag[r] * rhs[r];

      rhs[r] = 0;

      if(isNotZero(x, eps))
      {
         c = corig[i];
         vec[c] = x;
         val = &cval[cbeg[c]];
         idx = &cidx[cbeg[c]];
         j = clen[c];

         while(j-- > 0)
         {
            k = *idx++;
            assert(k >= 0 && k < thedim);
            y = rhs[k];

            if(y == 0)
            {
               y = -x * (*val++);

               if(isNotZero(y, eps))
               {
                  rhs[k] = y;
                  enQueueMax(ridx, &rn, rperm[k]);
               }
            }
            else
            {
               y -= x * (*val++);
               y += (y == 0) ? SOPLEX_FACTOR_MARKER : 0;
               rhs[k] = y;
            }
         }
      }
   }
}